

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

void __thiscall KokkosTools::ChromeTracing::State::end_frame(State *this)

{
  pointer pSVar1;
  
  pSVar1 = (this->current_stack).
           super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->current_stack).
      super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
      ._M_impl.super__Vector_impl_data._M_start != pSVar1) {
    if (this->first == false) {
      std::operator<<((ostream *)this,",\n");
      pSVar1 = (this->current_stack).
               super__Vector_base<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    this->first = false;
    StackNode::print(pSVar1 + -1,(ostream *)this);
    std::
    vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
    ::pop_back(&this->current_stack);
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "Attempting to end root stack frame before Kokkos::finalize()\n");
  return;
}

Assistant:

void end_frame() {
    if (current_stack.empty()) {
      std::cerr
          << "Attempting to end root stack frame before Kokkos::finalize()\n";
      return;
    }

    if (!first) outfile << ",\n";
    first = false;

    current_stack.back().print(outfile);
    current_stack.pop_back();
  }